

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall moira::Moira::dump32(Moira *this,char *str,u32 value)

{
  StrWriter local_48;
  
  local_48.style = &this->dataStyle;
  local_48.tab.raw = 8;
  local_48.comment[0] = '\0';
  local_48.base = str;
  local_48.ptr = str;
  StrWriter::operator<<(&local_48,(UInt32)value);
  StrWriter::operator<<(&local_48);
  return;
}

Assistant:

void
Moira::dump32(char *str, u32 value) const
{
    StrWriter(str, dataStyle) << UInt32{value} << Finish{};
}